

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  int iVar1;
  TestPartResult *pTVar2;
  ostream *poVar3;
  long *plVar4;
  pointer pTVar5;
  pointer pTVar6;
  internal *piVar7;
  int iVar8;
  int iVar9;
  string kIndent;
  string location;
  string message;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\n');
  pTVar6 = (result->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar5 = (result->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pTVar5 - (long)pTVar6) >> 4) * -0x49249249) {
    iVar9 = 0;
    iVar8 = 0;
    do {
      iVar1 = (int)pTVar6;
      pTVar2 = TestResult::GetTestPartResult(result,iVar8);
      if (pTVar2->type_ - kNonFatalFailure < 2) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        if (iVar9 == 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,(char *)local_d0,local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"failures",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": [\n",5);
        }
        piVar7 = (internal *)(pTVar2->file_name_)._M_string_length;
        if (piVar7 != (internal *)0x0) {
          piVar7 = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_90,piVar7,(char *)(ulong)(uint)pTVar2->line_number_,iVar1);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
        std::__cxx11::string::append((char *)local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_70);
        pTVar6 = (pointer)(plVar4 + 2);
        if ((pointer)*plVar4 == pTVar6) {
          local_b0.field_2._M_allocated_capacity = *(undefined8 *)pTVar6;
          local_b0.field_2._8_8_ = plVar4[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *(undefined8 *)pTVar6;
          local_b0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_b0._M_string_length = plVar4[1];
        *plVar4 = (long)pTVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        EscapeJson(&local_50,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  {\n",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"failure\": \"",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\n",3);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"type\": \"\"\n",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  }",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        iVar9 = iVar9 + 1;
      }
      iVar8 = iVar8 + 1;
      pTVar6 = (result->test_part_results_).
               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar5 = (result->test_part_results_).
               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar1 = (int)((ulong)((long)pTVar5 - (long)pTVar6) >> 4);
    } while (SBORROW4(iVar8,iVar1 * -0x49249249) != iVar8 + iVar1 * 0x49249249 < 0);
    if (0 < iVar9) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_d0,local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      pTVar6 = (result->test_part_results_).
               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar5 = (result->test_part_results_).
               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (0 < (int)((ulong)((long)pTVar5 - (long)pTVar6) >> 4) * -0x49249249) {
    iVar8 = 0;
    iVar9 = 0;
    do {
      pTVar2 = TestResult::GetTestPartResult(result,iVar8);
      iVar1 = (int)pTVar6;
      if (pTVar2->type_ == kSkip) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        if (iVar9 == 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,(char *)local_d0,local_c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"skipped",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": [\n",5);
        }
        piVar7 = (internal *)(pTVar2->file_name_)._M_string_length;
        if (piVar7 != (internal *)0x0) {
          piVar7 = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_90,piVar7,(char *)(ulong)(uint)pTVar2->line_number_,iVar1);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
        std::__cxx11::string::append((char *)local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_70);
        pTVar6 = (pointer)(plVar4 + 2);
        if ((pointer)*plVar4 == pTVar6) {
          local_b0.field_2._M_allocated_capacity = *(undefined8 *)pTVar6;
          local_b0.field_2._8_8_ = plVar4[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *(undefined8 *)pTVar6;
          local_b0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_b0._M_string_length = plVar4[1];
        *plVar4 = (long)pTVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        EscapeJson(&local_50,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  {\n",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \"message\": \"",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  }",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        iVar9 = iVar9 + 1;
      }
      iVar8 = iVar8 + 1;
      iVar1 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(iVar8,iVar1 * -0x49249249) != iVar8 + iVar1 * 0x49249249 < 0);
    if (0 < iVar9) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_d0,local_c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\b');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  {
    int failures = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.failed()) {
        *stream << ",\n";
        if (++failures == 1) {
          *stream << kIndent << "\"" << "failures" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"failure\": \"" << message << "\",\n"
                << kIndent << "    \"type\": \"\"\n"
                << kIndent << "  }";
      }
    }

    if (failures > 0) *stream << "\n" << kIndent << "]";
  }

  {
    int skipped = 0;
    for (int i = 0; i < result.total_part_count(); ++i) {
      const TestPartResult& part = result.GetTestPartResult(i);
      if (part.skipped()) {
        *stream << ",\n";
        if (++skipped == 1) {
          *stream << kIndent << "\"" << "skipped" << "\": [\n";
        }
        const std::string location =
            internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                            part.line_number());
        const std::string message =
            EscapeJson(location + "\n" + part.message());
        *stream << kIndent << "  {\n"
                << kIndent << "    \"message\": \"" << message << "\"\n"
                << kIndent << "  }";
      }
    }

    if (skipped > 0) *stream << "\n" << kIndent << "]";
  }

  *stream << "\n" << Indent(8) << "}";
}